

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

sunrealtype DotProd(int size,sunrealtype *x1,sunrealtype *x2)

{
  sunrealtype temp;
  sunrealtype *xx2;
  sunrealtype *xx1;
  int i;
  sunrealtype *x2_local;
  sunrealtype *x1_local;
  int size_local;
  
  temp = 0.0;
  xx2 = x2;
  xx1 = x1;
  for (i = 0; i < size; i = i + 1) {
    temp = *xx1 * *xx2 + temp;
    xx2 = xx2 + 1;
    xx1 = xx1 + 1;
  }
  return temp;
}

Assistant:

static sunrealtype DotProd(int size, sunrealtype* x1, sunrealtype* x2)
{
  int i;
  sunrealtype *xx1, *xx2, temp = ZERO;

  xx1 = x1;
  xx2 = x2;
  for (i = 0; i < size; i++) { temp += (*xx1++) * (*xx2++); }

  return (temp);
}